

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

MOJOSHADER_effect * MOJOSHADER_cloneEffect(MOJOSHADER_effect *effect)

{
  int iVar1;
  MOJOSHADER_symbolType MVar2;
  MOJOSHADER_malloc m;
  void *d;
  MOJOSHADER_effectState *pMVar3;
  long lVar4;
  uint uVar5;
  MOJOSHADER_effect *_effect;
  MOJOSHADER_error *pMVar6;
  size_t sVar7;
  char *pcVar8;
  MOJOSHADER_effectParam *pMVar9;
  MOJOSHADER_effectAnnotation *pMVar10;
  MOJOSHADER_effectTechnique *pMVar11;
  MOJOSHADER_effectPass *pMVar12;
  MOJOSHADER_effectState *pMVar13;
  MOJOSHADER_effectObject *pMVar14;
  void *pvVar15;
  MOJOSHADER_preshader *pMVar16;
  MOJOSHADER_parseData *pMVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  
  if (effect != &MOJOSHADER_out_of_mem_effect && effect != (MOJOSHADER_effect *)0x0) {
    m = effect->malloc;
    d = effect->malloc_data;
    _effect = (MOJOSHADER_effect *)(*m)(0x78,d);
    if (_effect != (MOJOSHADER_effect *)0x0) {
      _effect->malloc = (MOJOSHADER_malloc)0x0;
      _effect->free = (MOJOSHADER_free)0x0;
      *(undefined8 *)&_effect->restore_shader_state = 0;
      _effect->state_changes = (MOJOSHADER_effectStateChanges *)0x0;
      _effect->current_pass = 0;
      _effect->object_count = 0;
      _effect->objects = (MOJOSHADER_effectObject *)0x0;
      _effect->techniques = (MOJOSHADER_effectTechnique *)0x0;
      _effect->current_technique = (MOJOSHADER_effectTechnique *)0x0;
      _effect->params = (MOJOSHADER_effectParam *)0x0;
      *(undefined8 *)&_effect->technique_count = 0;
      _effect->profile = (char *)0x0;
      *(undefined8 *)&_effect->param_count = 0;
      *(undefined8 *)_effect = 0;
      _effect->errors = (MOJOSHADER_error *)0x0;
      _effect->malloc_data = (void *)0x0;
      _effect->malloc = effect->malloc;
      _effect->free = effect->free;
      _effect->malloc_data = effect->malloc_data;
      uVar20 = effect->error_count * 0x18;
      _effect->error_count = effect->error_count;
      pMVar6 = (MOJOSHADER_error *)(*m)(uVar20,d);
      _effect->errors = pMVar6;
      if (pMVar6 != (MOJOSHADER_error *)0x0) {
        memset(pMVar6,0,(ulong)uVar20);
        if (0 < _effect->error_count) {
          lVar24 = 0;
          lVar21 = 0;
          do {
            sVar7 = strlen(*(char **)((long)&effect->errors->error + lVar24));
            pcVar8 = (char *)(*m)((int)sVar7 + 1,d);
            if (pcVar8 == (char *)0x0) goto LAB_00125044;
            strcpy(pcVar8,*(char **)((long)&effect->errors->error + lVar24));
            *(char **)((long)&_effect->errors->error + lVar24) = pcVar8;
            sVar7 = strlen(*(char **)((long)&effect->errors->filename + lVar24));
            pcVar8 = (char *)(*m)((int)sVar7 + 1,d);
            if (pcVar8 == (char *)0x0) goto LAB_00125044;
            strcpy(pcVar8,*(char **)((long)&effect->errors->filename + lVar24));
            pMVar6 = _effect->errors;
            *(char **)((long)&pMVar6->filename + lVar24) = pcVar8;
            *(undefined4 *)((long)&pMVar6->error_position + lVar24) =
                 *(undefined4 *)((long)&effect->errors->error_position + lVar24);
            lVar21 = lVar21 + 1;
            lVar24 = lVar24 + 0x18;
          } while (lVar21 < _effect->error_count);
        }
        sVar7 = strlen(effect->profile);
        pcVar8 = (char *)(*m)((int)sVar7 + 1,d);
        if (pcVar8 != (char *)0x0) {
          strcpy(pcVar8,effect->profile);
          _effect->profile = pcVar8;
          iVar1 = effect->param_count;
          _effect->param_count = iVar1;
          uVar20 = iVar1 * 0x50;
          pMVar9 = (MOJOSHADER_effectParam *)(*m)(uVar20,d);
          _effect->params = pMVar9;
          if (pMVar9 != (MOJOSHADER_effectParam *)0x0) {
            memset(pMVar9,0,(ulong)uVar20);
            if (0 < _effect->param_count) {
              lVar21 = 0;
              do {
                copyvalue(&_effect->params[lVar21].value,&effect->params[lVar21].value,m,d);
                uVar20 = effect->params[lVar21].annotation_count;
                _effect->params[lVar21].annotation_count = uVar20;
                uVar20 = uVar20 << 6;
                pMVar10 = (MOJOSHADER_effectAnnotation *)(*m)(uVar20,d);
                _effect->params[lVar21].annotations = pMVar10;
                if (pMVar10 == (MOJOSHADER_effectAnnotation *)0x0) goto LAB_00125044;
                memset(pMVar10,0,(ulong)uVar20);
                pMVar9 = _effect->params;
                if (pMVar9[lVar21].annotation_count != 0) {
                  lVar24 = 0;
                  uVar22 = 0;
                  do {
                    copyvalue((MOJOSHADER_effectValue *)
                              ((long)&(pMVar9[lVar21].annotations)->name + lVar24),
                              (MOJOSHADER_effectValue *)
                              ((long)&(effect->params[lVar21].annotations)->name + lVar24),m,d);
                    uVar22 = uVar22 + 1;
                    pMVar9 = _effect->params;
                    lVar24 = lVar24 + 0x40;
                  } while (uVar22 < pMVar9[lVar21].annotation_count);
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < _effect->param_count);
            }
            uVar20 = effect->technique_count * 0x28;
            _effect->technique_count = effect->technique_count;
            pMVar11 = (MOJOSHADER_effectTechnique *)(*m)(uVar20,d);
            _effect->techniques = pMVar11;
            if (pMVar11 != (MOJOSHADER_effectTechnique *)0x0) {
              memset(pMVar11,0,(ulong)uVar20);
              if (0 < _effect->technique_count) {
                lVar21 = 0;
                do {
                  sVar7 = strlen(effect->techniques[lVar21].name);
                  pcVar8 = (char *)(*m)((int)sVar7 + 1,d);
                  if (pcVar8 == (char *)0x0) goto LAB_00125044;
                  strcpy(pcVar8,effect->techniques[lVar21].name);
                  pMVar11 = _effect->techniques;
                  pMVar11[lVar21].name = pcVar8;
                  uVar20 = effect->techniques[lVar21].pass_count;
                  uVar5 = uVar20 * 0x28;
                  pMVar11[lVar21].pass_count = uVar20;
                  pMVar12 = (MOJOSHADER_effectPass *)(*m)(uVar5,d);
                  _effect->techniques[lVar21].passes = pMVar12;
                  if (pMVar12 == (MOJOSHADER_effectPass *)0x0) goto LAB_00125044;
                  memset(pMVar12,0,(ulong)uVar5);
                  pMVar11 = _effect->techniques;
                  if (pMVar11[lVar21].pass_count != 0) {
                    uVar22 = 0;
                    do {
                      sVar7 = strlen(effect->techniques[lVar21].passes[uVar22].name);
                      pcVar8 = (char *)(*m)((int)sVar7 + 1,d);
                      if (pcVar8 == (char *)0x0) goto LAB_00125044;
                      strcpy(pcVar8,effect->techniques[lVar21].passes[uVar22].name);
                      pMVar12 = _effect->techniques[lVar21].passes;
                      pMVar12[uVar22].name = pcVar8;
                      uVar20 = effect->techniques[lVar21].passes[uVar22].state_count;
                      uVar5 = uVar20 * 0x48;
                      pMVar12[uVar22].state_count = uVar20;
                      pMVar13 = (MOJOSHADER_effectState *)(*m)(uVar5,d);
                      _effect->techniques[lVar21].passes[uVar22].states = pMVar13;
                      if (pMVar13 == (MOJOSHADER_effectState *)0x0) goto LAB_00125044;
                      memset(pMVar13,0,(ulong)uVar5);
                      pMVar12 = _effect->techniques[lVar21].passes;
                      if (pMVar12[uVar22].state_count != 0) {
                        lVar24 = 8;
                        uVar23 = 0;
                        do {
                          pMVar13 = effect->techniques[lVar21].passes[uVar22].states;
                          pMVar3 = pMVar12[uVar22].states;
                          *(undefined4 *)((long)pMVar3 + lVar24 + -8) =
                               *(undefined4 *)((long)pMVar13 + lVar24 + -8);
                          copyvalue((MOJOSHADER_effectValue *)((long)&pMVar3->type + lVar24),
                                    (MOJOSHADER_effectValue *)((long)&pMVar13->type + lVar24),m,d);
                          uVar23 = uVar23 + 1;
                          pMVar12 = _effect->techniques[lVar21].passes;
                          lVar24 = lVar24 + 0x48;
                        } while (uVar23 < pMVar12[uVar22].state_count);
                      }
                      uVar20 = effect->techniques[lVar21].passes[uVar22].annotation_count;
                      pMVar12[uVar22].annotation_count = uVar20;
                      uVar20 = uVar20 << 6;
                      pMVar10 = (MOJOSHADER_effectAnnotation *)(*m)(uVar20,d);
                      _effect->techniques[lVar21].passes[uVar22].annotations = pMVar10;
                      if (pMVar10 == (MOJOSHADER_effectAnnotation *)0x0) goto LAB_00125044;
                      memset(pMVar10,0,(ulong)uVar20);
                      pMVar12 = _effect->techniques[lVar21].passes;
                      if (pMVar12[uVar22].annotation_count != 0) {
                        lVar24 = 0;
                        uVar23 = 0;
                        do {
                          copyvalue((MOJOSHADER_effectValue *)
                                    ((long)&(pMVar12[uVar22].annotations)->name + lVar24),
                                    (MOJOSHADER_effectValue *)
                                    ((long)&(effect->techniques[lVar21].passes[uVar22].annotations)
                                            ->name + lVar24),m,d);
                          uVar23 = uVar23 + 1;
                          pMVar12 = _effect->techniques[lVar21].passes;
                          lVar24 = lVar24 + 0x40;
                        } while (uVar23 < pMVar12[uVar22].annotation_count);
                      }
                      uVar22 = uVar22 + 1;
                      pMVar11 = _effect->techniques;
                    } while (uVar22 < pMVar11[lVar21].pass_count);
                  }
                  uVar20 = effect->techniques[lVar21].annotation_count;
                  pMVar11[lVar21].annotation_count = uVar20;
                  uVar20 = uVar20 << 6;
                  pMVar10 = (MOJOSHADER_effectAnnotation *)(*m)(uVar20,d);
                  _effect->techniques[lVar21].annotations = pMVar10;
                  if (pMVar10 == (MOJOSHADER_effectAnnotation *)0x0) goto LAB_00125044;
                  memset(pMVar10,0,(ulong)uVar20);
                  pMVar11 = _effect->techniques;
                  if (pMVar11[lVar21].annotation_count != 0) {
                    lVar24 = 0;
                    uVar22 = 0;
                    do {
                      copyvalue((MOJOSHADER_effectValue *)
                                ((long)&(pMVar11[lVar21].annotations)->name + lVar24),
                                (MOJOSHADER_effectValue *)
                                ((long)&(effect->techniques[lVar21].annotations)->name + lVar24),m,d
                               );
                      uVar22 = uVar22 + 1;
                      pMVar11 = _effect->techniques;
                      lVar24 = lVar24 + 0x40;
                    } while (uVar22 < pMVar11[lVar21].annotation_count);
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < _effect->technique_count);
              }
              if (0 < (long)effect->technique_count) {
                pMVar11 = effect->techniques;
                lVar21 = 0;
                do {
                  if (pMVar11 == effect->current_technique) {
                    _effect->current_technique =
                         (MOJOSHADER_effectTechnique *)((long)_effect->techniques - lVar21);
                    break;
                  }
                  lVar21 = lVar21 + -0x28;
                  pMVar11 = pMVar11 + 1;
                } while ((long)effect->technique_count * 0x28 + lVar21 != 0);
              }
              if (_effect->current_technique == (MOJOSHADER_effectTechnique *)0x0) {
                __assert_fail("clone->current_technique != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                              ,0x626,
                              "MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *)"
                             );
              }
              iVar1 = effect->current_pass;
              _effect->current_pass = iVar1;
              if (iVar1 != -1) {
                __assert_fail("clone->current_pass == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                              ,0x628,
                              "MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *)"
                             );
              }
              uVar20 = effect->object_count * 0x48;
              _effect->object_count = effect->object_count;
              pMVar14 = (MOJOSHADER_effectObject *)(*m)(uVar20,d);
              _effect->objects = pMVar14;
              if (pMVar14 != (MOJOSHADER_effectObject *)0x0) {
                memset(pMVar14,0,(ulong)uVar20);
                if (_effect->object_count < 1) {
                  return _effect;
                }
                lVar21 = 0;
                do {
                  lVar24 = lVar21 * 0x48;
                  _effect->objects[lVar21].type = effect->objects[lVar21].type;
                  MVar2 = _effect->objects[lVar21].type;
                  if (MVar2 - MOJOSHADER_SYMTYPE_SAMPLER < 5) {
LAB_00124dc9:
                    sVar7 = strlen(*(char **)((long)effect->objects + lVar21 * 0x48 + 8));
                    pcVar8 = (char *)(*m)((int)sVar7 + 1,d);
                    if (pcVar8 == (char *)0x0) break;
                    strcpy(pcVar8,*(char **)((long)effect->objects + lVar24 + 8));
                    *(char **)((long)_effect->objects + lVar24 + 8) = pcVar8;
                  }
                  else if (MVar2 - MOJOSHADER_SYMTYPE_PIXELSHADER < 2) {
                    *(undefined4 *)((long)_effect->objects + lVar24 + 4) =
                         *(undefined4 *)((long)effect->objects + lVar24 + 4);
                    *(undefined4 *)((long)_effect->objects + lVar24 + 8) =
                         *(undefined4 *)((long)effect->objects + lVar24 + 8);
                    *(undefined4 *)((long)_effect->objects + lVar24 + 0xc) =
                         *(undefined4 *)((long)effect->objects + lVar24 + 0xc);
                    iVar1 = *(int *)((long)effect->objects + lVar24 + 0x10);
                    *(int *)((long)_effect->objects + lVar24 + 0x10) = iVar1;
                    uVar20 = iVar1 << 2;
                    pvVar15 = (*m)(uVar20,d);
                    *(void **)((long)_effect->objects + lVar24 + 0x18) = pvVar15;
                    memcpy(*(void **)((long)_effect->objects + lVar24 + 0x18),
                           *(void **)((long)effect->objects + lVar24 + 0x18),(ulong)uVar20);
                    iVar1 = *(int *)((long)effect->objects + lVar24 + 0x20);
                    *(int *)((long)_effect->objects + lVar24 + 0x20) = iVar1;
                    uVar20 = iVar1 << 2;
                    pvVar15 = (*m)(uVar20,d);
                    *(void **)((long)_effect->objects + lVar24 + 0x28) = pvVar15;
                    memcpy(*(void **)((long)_effect->objects + lVar24 + 0x28),
                           *(void **)((long)effect->objects + lVar24 + 0x28),(ulong)uVar20);
                    pMVar17 = *(MOJOSHADER_parseData **)((long)effect->objects + lVar24 + 0x40);
                    if (*(int *)((long)_effect->objects + lVar24 + 0xc) == 0) {
                      pMVar17 = copyparsedata(pMVar17,m,d);
                      *(MOJOSHADER_parseData **)((long)_effect->objects + lVar24 + 0x40) = pMVar17;
                      iVar1 = *(int *)((long)effect->objects + lVar24 + 0x30);
                      *(int *)((long)_effect->objects + lVar24 + 0x30) = iVar1;
                      pvVar15 = (*m)(iVar1 * 0x18,d);
                      *(void **)((long)_effect->objects + lVar24 + 0x38) = pvVar15;
                      pMVar14 = _effect->objects;
                      if (*(long *)((long)pMVar14 + lVar24 + 0x38) == 0) break;
                      lVar24 = *(long *)((long)pMVar14 + lVar21 * 0x48 + 0x40);
                      if (0 < *(int *)(lVar24 + 0xa0)) {
                        lVar18 = 0;
                        lVar19 = 0;
                        uVar20 = 0;
                        do {
                          if (*(int *)(*(long *)(lVar24 + 0xa8) + 8 + lVar18) == 3) {
                            lVar4 = (ulong)uVar20 * 0x18;
                            *(undefined8 *)(*(long *)((long)pMVar14 + lVar21 * 0x48 + 0x38) + lVar4)
                                 = *(undefined8 *)(*(long *)(lVar24 + 0xa8) + lVar18);
                            *(undefined4 *)
                             (*(long *)((long)pMVar14 + lVar21 * 0x48 + 0x38) + 8 + lVar4) =
                                 *(undefined4 *)
                                  (*(long *)(*(long *)((long)pMVar14 + lVar21 * 0x48 + 0x40) + 0xa8)
                                   + 0xc + lVar18);
                            pMVar9 = _effect->params;
                            *(uint *)(*(long *)((long)pMVar14 + lVar21 * 0x48 + 0x38) + 0xc + lVar4)
                                 = pMVar9[*(uint *)(*(long *)((long)pMVar14 + lVar21 * 0x48 + 0x28)
                                                   + lVar19 * 4)].value.value_count;
                            *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
                             (*(long *)((long)pMVar14 + lVar21 * 0x48 + 0x38) + 0x10 + lVar4) =
                                 pMVar9[*(uint *)(*(long *)((long)pMVar14 + lVar21 * 0x48 + 0x28) +
                                                 lVar19 * 4)].value.field_4;
                            uVar20 = uVar20 + 1;
                          }
                          lVar19 = lVar19 + 1;
                          lVar24 = *(long *)((long)pMVar14 + lVar21 * 0x48 + 0x40);
                          lVar18 = lVar18 + 0x38;
                        } while (lVar19 < *(int *)(lVar24 + 0xa0));
                      }
                    }
                    else {
                      pMVar16 = copypreshader((MOJOSHADER_preshader *)pMVar17,m,d);
                      *(MOJOSHADER_preshader **)((long)_effect->objects + lVar21 * 0x48 + 0x40) =
                           pMVar16;
                    }
                  }
                  else if (MVar2 == MOJOSHADER_SYMTYPE_STRING) goto LAB_00124dc9;
                  lVar21 = lVar21 + 1;
                  if (_effect->object_count <= lVar21) {
                    return _effect;
                  }
                } while( true );
              }
            }
          }
        }
      }
LAB_00125044:
      MOJOSHADER_freeEffect(_effect);
    }
  }
  return (MOJOSHADER_effect *)0x0;
}

Assistant:

MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *effect)
{
    int i, j, k;
    MOJOSHADER_effect *clone;
    MOJOSHADER_malloc m = effect->malloc;
    void *d = effect->malloc_data;
    uint32 siz = 0;
    char *stringcopy = NULL;
    uint32 curSampler;

    if ((effect == NULL) || (effect == &MOJOSHADER_out_of_mem_effect))
        return NULL;  // no-op.

    clone = (MOJOSHADER_effect *) m(sizeof (MOJOSHADER_effect), d);
    if (clone == NULL)
        return NULL; // Maybe out_of_mem_effect instead?
    memset(clone, '\0', sizeof (MOJOSHADER_effect));

    /* Copy malloc/free */
    clone->malloc = effect->malloc;
    clone->free = effect->free;
    clone->malloc_data = effect->malloc_data;

    #define COPY_STRING(location) \
        siz = strlen(effect->location) + 1; \
        stringcopy = (char *) m(siz, d); \
        if (stringcopy == NULL) \
            goto cloneEffect_outOfMemory; \
        strcpy(stringcopy, effect->location); \
        clone->location = stringcopy; \

    /* Copy errors */
    siz = sizeof (MOJOSHADER_error) * effect->error_count;
    clone->error_count = effect->error_count;
    clone->errors = (MOJOSHADER_error *) m(siz, d);
    if (clone->errors == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->errors, '\0', siz);
    for (i = 0; i < clone->error_count; i++)
    {
        COPY_STRING(errors[i].error)
        COPY_STRING(errors[i].filename)
        clone->errors[i].error_position = effect->errors[i].error_position;
    } // for

    /* Copy profile string */
    COPY_STRING(profile)

    /* Copy parameters */
    siz = sizeof (MOJOSHADER_effectParam) * effect->param_count;
    clone->param_count = effect->param_count;
    clone->params = (MOJOSHADER_effectParam *) m(siz, d);
    if (clone->params == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->params, '\0', siz);
    for (i = 0; i < clone->param_count; i++)
    {
        copyvalue(&clone->params[i].value, &effect->params[i].value, m, d);

        /* Copy parameter annotations */
        siz = sizeof (MOJOSHADER_effectAnnotation) * effect->params[i].annotation_count;
        clone->params[i].annotation_count = effect->params[i].annotation_count;
        clone->params[i].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
        if (clone->params[i].annotations == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->params[i].annotations, '\0', siz);
        for (j = 0; j < clone->params[i].annotation_count; j++)
            copyvalue(&clone->params[i].annotations[j],
                      &effect->params[i].annotations[j],
                      m, d);
    } // for

    /* Copy techniques */
    siz = sizeof (MOJOSHADER_effectTechnique) * effect->technique_count;
    clone->technique_count = effect->technique_count;
    clone->techniques = (MOJOSHADER_effectTechnique *) m(siz, d);
    if (clone->techniques == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->techniques, '\0', siz);
    for (i = 0; i < clone->technique_count; i++)
    {
        COPY_STRING(techniques[i].name)

        /* Copy passes */
        siz = sizeof (MOJOSHADER_effectPass) * effect->techniques[i].pass_count;
        clone->techniques[i].pass_count = effect->techniques[i].pass_count;
        clone->techniques[i].passes = (MOJOSHADER_effectPass *) m(siz, d);
        if (clone->techniques[i].passes == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->techniques[i].passes, '\0', siz);
        for (j = 0; j < clone->techniques[i].pass_count; j++)
        {
            COPY_STRING(techniques[i].passes[j].name)

            /* Copy pass states */
            siz = sizeof (MOJOSHADER_effectState) * effect->techniques[i].passes[j].state_count;
            clone->techniques[i].passes[j].state_count = effect->techniques[i].passes[j].state_count;
            clone->techniques[i].passes[j].states = (MOJOSHADER_effectState *) m(siz, d);
            if (clone->techniques[i].passes[j].states == NULL)
                goto cloneEffect_outOfMemory;
            memset(clone->techniques[i].passes[j].states, '\0', siz);
            for (k = 0; k < clone->techniques[i].passes[j].state_count; k++)
            {
                clone->techniques[i].passes[j].states[k].type = effect->techniques[i].passes[j].states[k].type;
                copyvalue(&clone->techniques[i].passes[j].states[k].value,
                          &effect->techniques[i].passes[j].states[k].value,
                          m, d);
            } // for

            /* Copy pass annotations */
            siz = sizeof (MOJOSHADER_effectAnnotation) * effect->techniques[i].passes[j].annotation_count;
            clone->techniques[i].passes[j].annotation_count = effect->techniques[i].passes[j].annotation_count;
            clone->techniques[i].passes[j].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
            if (clone->techniques[i].passes[j].annotations == NULL)
                goto cloneEffect_outOfMemory;
            memset(clone->techniques[i].passes[j].annotations, '\0', siz);
            for (k = 0; k < clone->techniques[i].passes[j].annotation_count; k++)
                copyvalue(&clone->techniques[i].passes[j].annotations[k],
                          &effect->techniques[i].passes[j].annotations[k],
                          m, d);
        } // for

        /* Copy technique annotations */
        siz = sizeof (MOJOSHADER_effectAnnotation) * effect->techniques[i].annotation_count;
        clone->techniques[i].annotation_count = effect->techniques[i].annotation_count;
        clone->techniques[i].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
        if (clone->techniques[i].annotations == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->techniques[i].annotations, '\0', siz);
        for (j = 0; j < clone->techniques[i].annotation_count; j++)
            copyvalue(&clone->techniques[i].annotations[j],
                      &effect->techniques[i].annotations[j],
                      m, d);
    } // for

    /* Copy the current technique/pass */
    for (i = 0; i < effect->technique_count; i++)
        if (&effect->techniques[i] == effect->current_technique)
        {
            clone->current_technique = &clone->techniques[i];
            break;
        } // if
    assert(clone->current_technique != NULL);
    clone->current_pass = effect->current_pass;
    assert(clone->current_pass == -1);

    /* Copy object table */
    siz = sizeof (MOJOSHADER_effectObject) * effect->object_count;
    clone->object_count = effect->object_count;
    clone->objects = (MOJOSHADER_effectObject *) m(siz, d);
    if (clone->objects == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->objects, '\0', siz);
    for (i = 0; i < clone->object_count; i++)
    {
        clone->objects[i].type = effect->objects[i].type;
        if (clone->objects[i].type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || clone->objects[i].type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            clone->objects[i].shader.technique = effect->objects[i].shader.technique;
            clone->objects[i].shader.pass = effect->objects[i].shader.pass;
            clone->objects[i].shader.is_preshader = effect->objects[i].shader.is_preshader;
            siz = sizeof (uint32) * effect->objects[i].shader.preshader_param_count;
            clone->objects[i].shader.preshader_param_count = effect->objects[i].shader.preshader_param_count;
            clone->objects[i].shader.preshader_params = (uint32 *) m(siz, d);
            memcpy(clone->objects[i].shader.preshader_params,
                   effect->objects[i].shader.preshader_params,
                   siz);
            siz = sizeof (uint32) * effect->objects[i].shader.param_count;
            clone->objects[i].shader.param_count = effect->objects[i].shader.param_count;
            clone->objects[i].shader.params = (uint32 *) m(siz, d);
            memcpy(clone->objects[i].shader.params,
                   effect->objects[i].shader.params,
                   siz);

            if (clone->objects[i].shader.is_preshader)
            {
                clone->objects[i].shader.preshader = copypreshader(effect->objects[i].shader.preshader,
                                                                   m, d);
                continue;
            } // if

            clone->objects[i].shader.shader = copyparsedata(effect->objects[i].shader.shader,
                                                            m, d);

            siz = sizeof (MOJOSHADER_samplerStateRegister) * effect->objects[i].shader.sampler_count;
            clone->objects[i].shader.sampler_count = effect->objects[i].shader.sampler_count;
            clone->objects[i].shader.samplers = (MOJOSHADER_samplerStateRegister *) m(siz, d);
            if (clone->objects[i].shader.samplers == NULL)
                goto cloneEffect_outOfMemory;
            curSampler = 0;
            for (j = 0; j < clone->objects[i].shader.shader->symbol_count; j++)
                if (clone->objects[i].shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                {
                    clone->objects[i].shader.samplers[curSampler].sampler_name = clone->objects[i].shader.shader->symbols[j].name;
                    clone->objects[i].shader.samplers[curSampler].sampler_register = clone->objects[i].shader.shader->symbols[j].register_index;
                    clone->objects[i].shader.samplers[curSampler].sampler_state_count = clone->params[clone->objects[i].shader.params[j]].value.value_count;
                    clone->objects[i].shader.samplers[curSampler].sampler_states = clone->params[clone->objects[i].shader.params[j]].value.valuesSS;
                    curSampler++;
                } // if
        } // if
        else if (clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            COPY_STRING(objects[i].mapping.name)
        } // else if
        else if (clone->objects[i].type == MOJOSHADER_SYMTYPE_STRING)
        {
            COPY_STRING(objects[i].string.string)
        } // else if
    } // for

    #undef COPY_STRING

    return clone;

cloneEffect_outOfMemory:
    MOJOSHADER_freeEffect(clone);
    return NULL;
}